

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O1

void pty_open_master(Pty *pty)

{
  int iVar1;
  char *__src;
  timeval tStack_38;
  Pty *pPStack_28;
  
  iVar1 = posix_openpt(0x102);
  pty->master_fd = iVar1;
  if (iVar1 < 0) {
    pty_open_master_cold_3();
  }
  else {
    iVar1 = grantpt(iVar1);
    if (-1 < iVar1) {
      iVar1 = unlockpt(pty->master_fd);
      if (-1 < iVar1) {
        cloexec(pty->master_fd);
        pty->name[0xfff] = '\0';
        __src = ptsname(pty->master_fd);
        strncpy(pty->name,__src,0xfff);
        nonblock(pty->master_fd);
        return;
      }
      goto LAB_00112e91;
    }
  }
  pty_open_master_cold_2();
LAB_00112e91:
  pty_open_master_cold_1();
  if (pty_stamped_utmp == '\x01') {
    utmp_entry.ut_type = 8;
    utmp_entry.ut_user[0] = '\0';
    utmp_entry.ut_user[1] = '\0';
    utmp_entry.ut_user[2] = '\0';
    utmp_entry.ut_user[3] = '\0';
    utmp_entry.ut_user[4] = '\0';
    utmp_entry.ut_user[5] = '\0';
    utmp_entry.ut_user[6] = '\0';
    utmp_entry.ut_user[7] = '\0';
    utmp_entry.ut_user[8] = '\0';
    utmp_entry.ut_user[9] = '\0';
    utmp_entry.ut_user[10] = '\0';
    utmp_entry.ut_user[0xb] = '\0';
    utmp_entry.ut_user[0xc] = '\0';
    utmp_entry.ut_user[0xd] = '\0';
    utmp_entry.ut_user[0xe] = '\0';
    utmp_entry.ut_user[0xf] = '\0';
    utmp_entry.ut_user[0x10] = '\0';
    utmp_entry.ut_user[0x11] = '\0';
    utmp_entry.ut_user[0x12] = '\0';
    utmp_entry.ut_user[0x13] = '\0';
    utmp_entry.ut_user[0x14] = '\0';
    utmp_entry.ut_user[0x15] = '\0';
    utmp_entry.ut_user[0x16] = '\0';
    utmp_entry.ut_user[0x17] = '\0';
    utmp_entry.ut_user[0x18] = '\0';
    utmp_entry.ut_user[0x19] = '\0';
    utmp_entry.ut_user[0x1a] = '\0';
    utmp_entry.ut_user[0x1b] = '\0';
    utmp_entry.ut_user[0x1c] = '\0';
    utmp_entry.ut_user[0x1d] = '\0';
    utmp_entry.ut_user[0x1e] = '\0';
    utmp_entry.ut_user[0x1f] = '\0';
    pPStack_28 = pty;
    gettimeofday(&tStack_38,(__timezone_ptr_t)0x0);
    utmp_entry.ut_tv.tv_usec = (__int32_t)tStack_38.tv_usec;
    utmp_entry.ut_tv.tv_sec = (__int32_t)tStack_38.tv_sec;
    updwtmpx("/var/log/wtmp",(utmpx *)&utmp_entry);
    utmp_entry.ut_line[0x10] = '\0';
    utmp_entry.ut_line[0x11] = '\0';
    utmp_entry.ut_line[0x12] = '\0';
    utmp_entry.ut_line[0x13] = '\0';
    utmp_entry.ut_line[0x14] = '\0';
    utmp_entry.ut_line[0x15] = '\0';
    utmp_entry.ut_line[0x16] = '\0';
    utmp_entry.ut_line[0x17] = '\0';
    utmp_entry.ut_line[0x18] = '\0';
    utmp_entry.ut_line[0x19] = '\0';
    utmp_entry.ut_line[0x1a] = '\0';
    utmp_entry.ut_line[0x1b] = '\0';
    utmp_entry.ut_line[0x1c] = '\0';
    utmp_entry.ut_line[0x1d] = '\0';
    utmp_entry.ut_line[0x1e] = '\0';
    utmp_entry.ut_line[0x1f] = '\0';
    utmp_entry.ut_line[0] = '\0';
    utmp_entry.ut_line[1] = '\0';
    utmp_entry.ut_line[2] = '\0';
    utmp_entry.ut_line[3] = '\0';
    utmp_entry.ut_line[4] = '\0';
    utmp_entry.ut_line[5] = '\0';
    utmp_entry.ut_line[6] = '\0';
    utmp_entry.ut_line[7] = '\0';
    utmp_entry.ut_line[8] = '\0';
    utmp_entry.ut_line[9] = '\0';
    utmp_entry.ut_line[10] = '\0';
    utmp_entry.ut_line[0xb] = '\0';
    utmp_entry.ut_line[0xc] = '\0';
    utmp_entry.ut_line[0xd] = '\0';
    utmp_entry.ut_line[0xe] = '\0';
    utmp_entry.ut_line[0xf] = '\0';
    utmp_entry.ut_tv.tv_sec = 0;
    utmp_entry.ut_tv.tv_usec = 0;
    setutxent();
    pututxline((utmpx *)&utmp_entry);
    endutxent();
    pty_stamped_utmp = '\0';
  }
  return;
}

Assistant:

static void pty_open_master(Pty *pty)
{
#ifdef BSD_PTYS
    const char chars1[] = "pqrstuvwxyz";
    const char chars2[] = "0123456789abcdef";
    const char *p1, *p2;
    char master_name[20];
    struct group *gp;

    for (p1 = chars1; *p1; p1++)
        for (p2 = chars2; *p2; p2++) {
            sprintf(master_name, "/dev/pty%c%c", *p1, *p2);
            pty->master_fd = open(master_name, O_RDWR);
            if (pty->master_fd >= 0) {
                if (geteuid() == 0 ||
                    access(master_name, R_OK | W_OK) == 0) {
                    /*
                     * We must also check at this point that we are
                     * able to open the slave side of the pty. We
                     * wouldn't want to allocate the wrong master,
                     * get all the way down to forking, and _then_
                     * find we're unable to open the slave.
                     */
                    strcpy(pty->name, master_name);
                    pty->name[5] = 't'; /* /dev/ptyXX -> /dev/ttyXX */

                    cloexec(pty->master_fd);

                    if (pty_open_slave(pty) >= 0 &&
                        access(pty->name, R_OK | W_OK) == 0)
                        goto got_one;
                    if (pty->slave_fd > 0)
                        close(pty->slave_fd);
                    pty->slave_fd = -1;
                }
                close(pty->master_fd);
            }
        }

    /* If we get here, we couldn't get a tty at all. */
    fprintf(stderr, "pterm: unable to open a pseudo-terminal device\n");
    exit(1);

    got_one:

    /* We need to chown/chmod the /dev/ttyXX device. */
    gp = getgrnam("tty");
    chown(pty->name, getuid(), gp ? gp->gr_gid : -1);
    chmod(pty->name, 0600);
#else

    const int flags = O_RDWR
#ifdef O_NOCTTY
        | O_NOCTTY
#endif
        ;

#if HAVE_POSIX_OPENPT
#ifdef SET_NONBLOCK_VIA_OPENPT
    /*
     * OS X, as of 10.10 at least, doesn't permit me to set O_NONBLOCK
     * on pty master fds via the usual fcntl mechanism. Fortunately,
     * it does let me work around this by adding O_NONBLOCK to the
     * posix_openpt flags parameter, which isn't a documented use of
     * the API but seems to work. So we'll do that for now.
     */
    pty->master_fd = posix_openpt(flags | O_NONBLOCK);
#else
    pty->master_fd = posix_openpt(flags);
#endif

    if (pty->master_fd < 0) {
        perror("posix_openpt");
        exit(1);
    }
#else
    pty->master_fd = open("/dev/ptmx", flags);

    if (pty->master_fd < 0) {
        perror("/dev/ptmx: open");
        exit(1);
    }
#endif

    if (grantpt(pty->master_fd) < 0) {
        perror("grantpt");
        exit(1);
    }

    if (unlockpt(pty->master_fd) < 0) {
        perror("unlockpt");
        exit(1);
    }

    cloexec(pty->master_fd);

    pty->name[FILENAME_MAX-1] = '\0';
    strncpy(pty->name, ptsname(pty->master_fd), FILENAME_MAX-1);
#endif

#ifndef SET_NONBLOCK_VIA_OPENPT
    nonblock(pty->master_fd);
#endif
}